

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

Gia_Man_t * Unr_ManUnrollFrame(Unr_Man_t *p,int f)

{
  Vec_Int_t *p_00;
  ulong uVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iLit1;
  Unr_Obj_t *pObj;
  Unr_Obj_t *pUVar4;
  uint uVar5;
  uint uVar6;
  int i;
  int iVar7;
  uint uVar8;
  char *__assertion;
  
  for (iVar7 = 0; iVar7 < p->pGia->vCis->nSize - p->pGia->nRegs; iVar7 = iVar7 + 1) {
    p_00 = p->vPiLits;
    iVar3 = Gia_ManAppendCi(p->pFrames);
    Vec_IntPush(p_00,iVar3);
  }
  iVar3 = ~f + p->vObjLim->nSize;
  iVar7 = 0;
  if (0 < iVar3) {
    iVar7 = iVar3;
  }
  iVar7 = Vec_IntEntry(p->vObjLim,iVar7);
  do {
    if (p->pEnd <= p->pObjs + iVar7) {
      if (p->pObjs + iVar7 != p->pEnd) {
        __assert_fail("p->pObjs + hStart == p->pEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                      ,0x19a,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
      }
      pGVar2 = p->pFrames;
      if (pGVar2->vCos->nSize - pGVar2->nRegs == (p->pGia->vCos->nSize - p->pGia->nRegs) * (f + 1))
      {
        return pGVar2;
      }
      __assert_fail("Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                    ,0x19b,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
    }
    pObj = Unr_ManObj(p,iVar7);
    uVar1 = *(ulong *)&pObj->field_0x8;
    uVar5 = (uint)uVar1 & 0xfffe0000;
    if (uVar5 == 0xfffe0000 || (uVar1 & 0x1fffc) == 0x1fffc) {
      if ((int)(uVar1 & 0x1fffc) == 0x1fffc || uVar5 != 0xfffe0000) {
        if (((uVar1 & 0x100000000) == 0) || (f < (int)pObj->hFan1)) {
          __assert_fail("pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x194,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
        }
        iVar3 = Vec_IntEntry(p->vPiLits,
                             (p->pGia->vCis->nSize - p->pGia->nRegs) * (f - pObj->hFan1) +
                             pObj->hFan0);
        goto LAB_004afb57;
      }
      iVar3 = Unr_ManFanin0Value(p,pObj);
      Unr_ManObjSetValue(pObj,iVar3);
      if ((pObj->field_0xc & 2) != 0) {
        Gia_ManAppendCo(p->pFrames,iVar3);
      }
    }
    else {
      iVar3 = Unr_ManFanin0Value(p,pObj);
      pUVar4 = Unr_ManObj(p,pObj->hFan1);
      uVar5 = (uint)((ulong)*(undefined8 *)&pUVar4->field_0x8 >> 0x20);
      uVar8 = uVar5 >> 2 & 0x7fff;
      uVar5 = uVar5 >> 0x11;
      if (uVar8 <= uVar5) {
        __assertion = "pFanin->RankCur < pFanin->RankMax";
        uVar5 = 0x54;
LAB_004afbec:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                      ,uVar5,"int Unr_ManFanin1Value(Unr_Man_t *, Unr_Obj_t *)");
      }
      uVar6 = *(uint *)&pObj->field_0x8 >> 0x11;
      if (uVar8 <= uVar6) {
        __assertion = "pObj->uRDiff1 < pFanin->RankMax";
        uVar5 = 0x55;
        goto LAB_004afbec;
      }
      iLit1 = Abc_LitNotCond(pUVar4->Res[(int)((uVar5 + uVar8) - uVar6) % (int)uVar8],
                             *(uint *)&pObj->field_0x8 >> 1 & 1);
      iVar3 = Gia_ManHashAnd(p->pFrames,iVar3,iLit1);
LAB_004afb57:
      Unr_ManObjSetValue(pObj,iVar3);
    }
    iVar7 = iVar7 + ((uint)((ulong)*(undefined8 *)&pObj->field_0x8 >> 0x22) & 0x7ffe) + 6;
  } while( true );
}

Assistant:

Gia_Man_t * Unr_ManUnrollFrame( Unr_Man_t * p, int f )
{
    int i, iLit, iLit0, iLit1, hStart;
    for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
        Vec_IntPush( p->vPiLits, Gia_ManAppendCi(p->pFrames) );
    hStart = Vec_IntEntry( p->vObjLim, Abc_MaxInt(0, Vec_IntSize(p->vObjLim)-1-f) );
    while ( p->pObjs + hStart < p->pEnd )
    {
        Unr_Obj_t * pUnrObj = Unr_ManObj( p, hStart );
        if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 != UNR_DIFF_NULL ) // AND node
        {
            iLit0 = Unr_ManFanin0Value( p, pUnrObj );
            iLit1 = Unr_ManFanin1Value( p, pUnrObj );
            iLit  = Gia_ManHashAnd( p->pFrames, iLit0, iLit1 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        else if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 == UNR_DIFF_NULL ) // PO/RI/RO
        {
            iLit  = Unr_ManFanin0Value( p, pUnrObj );
            Unr_ManObjSetValue( pUnrObj, iLit );
            if ( pUnrObj->fItIsPo )
                Gia_ManAppendCo( p->pFrames, iLit );
        }
        else // PI  (pUnrObj->hFan0 is CioId; pUnrObj->hFan1 is tent)
        {
            assert( pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1 );
            iLit = Vec_IntEntry( p->vPiLits, Gia_ManPiNum(p->pGia) * (f - pUnrObj->hFan1) + pUnrObj->hFan0 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        hStart += Unr_ObjSize( pUnrObj );
    }
    assert( p->pObjs + hStart == p->pEnd );
    assert( Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia) );
    return p->pFrames;
}